

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O0

void Aig_ObjAddFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  int iVar1;
  int Num;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *local_60;
  int nFansAlloc;
  int *pNext;
  int *pPrev;
  int *pNextC;
  int *pPrevC;
  int *pFirst;
  int iFan;
  Aig_Obj_t *pFanout_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                  ,0x6e,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    iVar1 = Aig_IsComplement(pFanout);
    if (iVar1 == 0) {
      if (pFanout->Id < 1) {
        __assert_fail("pFanout->Id > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                      ,0x70,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if ((p->nFansAlloc <= pObj->Id) || (p->nFansAlloc <= pFanout->Id)) {
        iVar1 = Abc_MaxInt(pObj->Id,pFanout->Id);
        if (p->pFanData == (int *)0x0) {
          local_60 = (int *)malloc((long)(iVar1 * 10) << 2);
        }
        else {
          local_60 = (int *)realloc(p->pFanData,(long)(iVar1 * 10) << 2);
        }
        p->pFanData = local_60;
        memset(p->pFanData + p->nFansAlloc * 5,0,(long)(iVar1 * 2 - p->nFansAlloc) * 0x14);
        p->nFansAlloc = iVar1 * 2;
      }
      if ((pObj->Id < p->nFansAlloc) && (pFanout->Id < p->nFansAlloc)) {
        iVar1 = pFanout->Id;
        Num = Aig_ObjWhatFanin(pFanout,pObj);
        iVar1 = Aig_FanoutCreate(iVar1,Num);
        piVar2 = Aig_FanoutPrev(p->pFanData,iVar1);
        piVar3 = Aig_FanoutNext(p->pFanData,iVar1);
        piVar4 = Aig_FanoutObj(p->pFanData,pObj->Id);
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
          *piVar2 = iVar1;
          *piVar3 = iVar1;
        }
        else {
          piVar5 = Aig_FanoutPrev(p->pFanData,*piVar4);
          piVar6 = Aig_FanoutNext(p->pFanData,*piVar5);
          if (*piVar6 != *piVar4) {
            __assert_fail("*pNext == *pFirst",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                          ,0x87,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          *piVar2 = *piVar5;
          *piVar3 = *piVar4;
          *piVar5 = iVar1;
          *piVar6 = iVar1;
        }
        return;
      }
      __assert_fail("pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                    ,0x78,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  __assert_fail("!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                ,0x6f,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjAddFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    if ( pObj->Id >= p->nFansAlloc || pFanout->Id >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( pObj->Id, pFanout->Id ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Aig_FanoutPrev( p->pFanData, *pFirst );
        pNext = Aig_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}